

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O2

void fiber_destroy(Fiber *fbr)

{
  size_t sVar1;
  ulong uVar2;
  ushort uVar3;
  void *p;
  
  uVar3 = fbr->state;
  if ((uVar3 & 1) != 0) {
    __assert_fail("!fiber_is_executing(fbr)",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonfxr[P]fiber/src/fiber.c",
                  0xee,"void fiber_destroy(Fiber *)");
  }
  if ((uVar3 & 2) == 0) {
    p = fbr->alloc_stack;
    if (p != (void *)0x0) {
      if ((uVar3 & 0x18) != 0) {
        sVar1 = get_page_size();
        uVar2 = ((fbr->stack_size + sVar1) - 1) / sVar1;
        if ((uVar3 & 8) != 0) {
          uVar2 = uVar2 + 1;
          protect_page(p,true);
          uVar3 = fbr->state;
          p = fbr->alloc_stack;
        }
        if ((uVar3 & 0x10) != 0) {
          protect_page((void *)((long)p + uVar2 * sVar1),true);
          p = fbr->alloc_stack;
        }
      }
      free(p);
      (fbr->regs).sp = (void *)0x0;
      fbr->stack = (void *)0x0;
      fbr->alloc_stack = (void *)0x0;
      fbr->stack_size = 0;
    }
    return;
  }
  __assert_fail("!fiber_is_toplevel(fbr)",
                "/workspace/llm4binary/github/license_c_cmakelists/simonfxr[P]fiber/src/fiber.c",
                0xef,"void fiber_destroy(Fiber *)");
}

Assistant:

void
fiber_destroy(Fiber *fbr)
{
    assert(!fiber_is_executing(fbr));
    assert(!fiber_is_toplevel(fbr));

    if (!fbr->alloc_stack)
        return;

    if (fbr->state &
        (FIBER_FS_HAS_HI_GUARD_PAGE | FIBER_FS_HAS_LO_GUARD_PAGE)) {
        size_t pgsz = get_page_size();
        size_t npages = (fbr->stack_size + pgsz - 1) / pgsz;
        if (fbr->state & FIBER_FS_HAS_LO_GUARD_PAGE) {
            ++npages;
            protect_page(fbr->alloc_stack, true);
        }

        if (fbr->state & FIBER_FS_HAS_HI_GUARD_PAGE) {
            protect_page((char *) fbr->alloc_stack + npages * pgsz, true);
        }

        free_pages(fbr->alloc_stack);
    } else {
        free(fbr->alloc_stack);
    }

    fbr->stack = NULL;
    fbr->stack_size = 0;
    fbr->regs.sp = NULL;
    fbr->alloc_stack = NULL;
}